

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O3

void __thiscall
TEST_TestHarness_c_checkStringText_Test::~TEST_TestHarness_c_checkStringText_Test
          (TEST_TestHarness_c_checkStringText_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestHarness_c, checkStringText)
{
    CHECK_EQUAL_C_STRING_TEXT("Hello", "Hello", "Text");
    fixture->setTestFunction(failStringTextMethod_);
    fixture->runAllTests();

    StringEqualFailure failure(UtestShell::getCurrent(), "file", 1, "Hello", "Hello World", "");
    fixture->assertPrintContains(failure.getMessage());
    fixture->assertPrintContains("arness_c");
    fixture->assertPrintContains("Message: StringTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}